

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParseDocTypeDecl(htmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  bool bVar2;
  xmlChar *URI;
  xmlChar *ExternalID;
  xmlChar *name;
  htmlParserCtxtPtr ctxt_local;
  
  URI = (xmlChar *)0x0;
  ctxt->input->cur = ctxt->input->cur + 9;
  ctxt->input->col = ctxt->input->col + 9;
  name = (xmlChar *)ctxt;
  htmlSkipBlankChars(ctxt);
  ExternalID = htmlParseName((htmlParserCtxtPtr)name);
  if (ExternalID == (xmlChar *)0x0) {
    htmlParseErr((xmlParserCtxtPtr)name,XML_ERR_NAME_REQUIRED,
                 "htmlParseDocTypeDecl : no DOCTYPE name !\n",(xmlChar *)0x0,(xmlChar *)0x0);
  }
  htmlSkipBlankChars((xmlParserCtxtPtr)name);
  pxVar1 = htmlParseExternalID((htmlParserCtxtPtr)name,&URI);
  htmlSkipBlankChars((xmlParserCtxtPtr)name);
  if (**(char **)(*(long *)(name + 0x38) + 0x20) != '>') {
    htmlParseErr((xmlParserCtxtPtr)name,XML_ERR_DOCTYPE_NOT_FINISHED,
                 "DOCTYPE improperly terminated\n",(xmlChar *)0x0,(xmlChar *)0x0);
    while( true ) {
      bVar2 = false;
      if (**(char **)(*(long *)(name + 0x38) + 0x20) != '\0') {
        bVar2 = **(char **)(*(long *)(name + 0x38) + 0x20) != '>';
      }
      if (!bVar2) break;
      xmlNextChar((xmlParserCtxtPtr)name);
    }
  }
  if (**(char **)(*(long *)(name + 0x38) + 0x20) == '>') {
    xmlNextChar((xmlParserCtxtPtr)name);
  }
  if (((*(long *)name != 0) && (**(long **)name != 0)) && (*(int *)(name + 0x14c) == 0)) {
    (*(code *)**(undefined8 **)name)(*(undefined8 *)(name + 8),ExternalID,URI,pxVar1);
  }
  if (pxVar1 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar1);
  }
  if (URI != (xmlChar *)0x0) {
    (*xmlFree)(URI);
  }
  return;
}

Assistant:

static void
htmlParseDocTypeDecl(htmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlChar *ExternalID = NULL;
    xmlChar *URI = NULL;

    /*
     * We know that '<!DOCTYPE' has been detected.
     */
    SKIP(9);

    SKIP_BLANKS;

    /*
     * Parse the DOCTYPE name.
     */
    name = htmlParseName(ctxt);
    if (name == NULL) {
	htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	             "htmlParseDocTypeDecl : no DOCTYPE name !\n",
		     NULL, NULL);
    }
    /*
     * Check that upper(name) == "HTML" !!!!!!!!!!!!!
     */

    SKIP_BLANKS;

    /*
     * Check for SystemID and ExternalID
     */
    URI = htmlParseExternalID(ctxt, &ExternalID);
    SKIP_BLANKS;

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if (CUR != '>') {
	htmlParseErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED,
	             "DOCTYPE improperly terminated\n", NULL, NULL);
        /* Ignore bogus content */
        while ((CUR != 0) && (CUR != '>'))
            NEXT;
    }
    if (CUR == '>')
        NEXT;

    /*
     * Create or update the document accordingly to the DOCTYPE
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->internalSubset != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->internalSubset(ctxt->userData, name, ExternalID, URI);

    /*
     * Cleanup, since we don't use all those identifiers
     */
    if (URI != NULL) xmlFree(URI);
    if (ExternalID != NULL) xmlFree(ExternalID);
}